

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# completion_handler.hpp
# Opt level: O3

void asio::detail::
     completion_handler<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/continental[P]fineftp-server/fineftp-server/src/ftp_session.cpp:70:32),_asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
     ::do_complete(void *owner,operation *base,error_code *param_3,size_t param_4)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  ptr p;
  ptr local_70;
  anon_class_48_2_3c81cf3a_for_handler_ local_58;
  
  local_70.h = (anon_class_48_2_3c81cf3a_for_handler_ *)(base + 1);
  local_58.me.super___shared_ptr<fineftp::FtpSession,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ =
       *(undefined4 *)&base[1].next_;
  local_58.me.super___shared_ptr<fineftp::FtpSession,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       *(undefined4 *)((long)&base[1].next_ + 4);
  local_58.me.super___shared_ptr<fineftp::FtpSession,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _0_4_ = *(undefined4 *)&base[1].func_;
  local_58.me.super___shared_ptr<fineftp::FtpSession,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _4_4_ = *(undefined4 *)((long)&base[1].func_ + 4);
  base[1].func_ = (func_type)0x0;
  base[1].next_ = (scheduler_operation *)0x0;
  paVar1 = &local_58.raw_message.field_2;
  local_70.v = (completion_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_continental[P]fineftp_server_fineftp_server_src_ftp_session_cpp:70:32),_asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
                *)base;
  local_70.p = (completion_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_continental[P]fineftp_server_fineftp_server_src_ftp_session_cpp:70:32),_asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
                *)base;
  local_58.raw_message._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58.raw_message,*(long *)&base[1].task_result_,
             (long)&(base[2].next_)->next_ + *(long *)&base[1].task_result_);
  local_70.h = &local_58;
  ptr::reset(&local_70);
  if (owner != (void *)0x0) {
    lVar4 = CONCAT44(local_58.me.super___shared_ptr<fineftp::FtpSession,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr._4_4_,
                     local_58.me.super___shared_ptr<fineftp::FtpSession,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr._0_4_);
    lVar2 = *(long *)(lVar4 + 0x120);
    lVar3 = *(long *)(lVar4 + 0x140);
    fineftp::std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(lVar4 + 0x110),&local_58.raw_message);
    if (lVar3 == lVar2) {
      fineftp::FtpSession::startSendingMessages
                ((FtpSession *)
                 CONCAT44(local_58.me.
                          super___shared_ptr<fineftp::FtpSession,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                          ._4_4_,local_58.me.
                                 super___shared_ptr<fineftp::FtpSession,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr._0_4_));
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.raw_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_58.raw_message._M_dataplus._M_p,
                    local_58.raw_message.field_2._M_allocated_capacity + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      CONCAT44(local_58.me.super___shared_ptr<fineftp::FtpSession,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._4_4_,
               local_58.me.super___shared_ptr<fineftp::FtpSession,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._0_4_) != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT44(local_58.me.
                        super___shared_ptr<fineftp::FtpSession,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._4_4_,
                        local_58.me.
                        super___shared_ptr<fineftp::FtpSession,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._0_4_));
  }
  ptr::reset(&local_70);
  return;
}

Assistant:

static void do_complete(void* owner, operation* base,
      const asio::error_code& /*ec*/,
      std::size_t /*bytes_transferred*/)
  {
    // Take ownership of the handler object.
    completion_handler* h(static_cast<completion_handler*>(base));
    ptr p = { asio::detail::addressof(h->handler_), h, h };

    ASIO_HANDLER_COMPLETION((*h));

    // Take ownership of the operation's outstanding work.
    handler_work<Handler, IoExecutor> w(
        ASIO_MOVE_CAST2(handler_work<Handler, IoExecutor>)(
          h->work_));

    // Make a copy of the handler so that the memory can be deallocated before
    // the upcall is made. Even if we're not about to make an upcall, a
    // sub-object of the handler may be the true owner of the memory associated
    // with the handler. Consequently, a local copy of the handler is required
    // to ensure that any owning sub-object remains valid until after we have
    // deallocated the memory here.
    Handler handler(ASIO_MOVE_CAST(Handler)(h->handler_));
    p.h = asio::detail::addressof(handler);
    p.reset();

    // Make the upcall if required.
    if (owner)
    {
      fenced_block b(fenced_block::half);
      ASIO_HANDLER_INVOCATION_BEGIN(());
      w.complete(handler, handler);
      ASIO_HANDLER_INVOCATION_END;
    }
  }